

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemSetStr(Mem *pMem,char *z,i64 n,u8 enc,_func_void_void_ptr *xDel)

{
  int iVar1;
  byte in_CL;
  ushort uVar2;
  sqlite3 *in_RDX;
  char *in_RSI;
  long in_RDI;
  code *in_R8;
  bool bVar3;
  i64 nAlloc;
  u16 flags;
  int iLimit;
  i64 nByte;
  sqlite3 *in_stack_ffffffffffffff98;
  sqlite3 *in_stack_ffffffffffffffa0;
  sqlite3 *local_48;
  ushort local_3e;
  int local_3c;
  sqlite3 *local_38;
  byte local_21;
  int local_4;
  
  if (in_RSI == (char *)0x0) {
    sqlite3VdbeMemSetNull((Mem *)0x13e959);
    local_4 = 0;
  }
  else {
    if (*(long *)(in_RDI + 0x18) == 0) {
      local_3c = 1000000000;
    }
    else {
      local_3c = *(int *)(*(long *)(in_RDI + 0x18) + 0x88);
    }
    local_21 = in_CL;
    if ((long)in_RDX < 0) {
      if (in_CL == 1) {
        local_38 = (sqlite3 *)strlen(in_RSI);
      }
      else {
        local_38 = (sqlite3 *)0x0;
        while( true ) {
          bVar3 = false;
          if ((long)local_38 <= (long)local_3c) {
            bVar3 = in_RSI[(long)local_38] != '\0' || (in_RSI + 1)[(long)local_38] != '\0';
          }
          if (!bVar3) break;
          local_38 = (sqlite3 *)((long)&local_38->pVfs + 2);
        }
      }
      local_3e = 0x202;
    }
    else {
      local_38 = in_RDX;
      if (in_CL == 0) {
        local_3e = 0x10;
        local_21 = 1;
      }
      else {
        local_3e = 2;
      }
    }
    if ((long)local_3c < (long)local_38) {
      if ((in_R8 != (code *)0x0) && (in_R8 != (code *)0xffffffffffffffff)) {
        if (in_R8 == sqlite3OomClear) {
          sqlite3DbFree(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        }
        else {
          (*in_R8)(in_RSI);
        }
      }
      sqlite3VdbeMemSetNull((Mem *)0x13eaa5);
      local_4 = sqlite3ErrorToParser(*(sqlite3 **)(in_RDI + 0x18),0x12);
    }
    else {
      if (in_R8 == (code *)0xffffffffffffffff) {
        local_48 = local_38;
        if ((local_3e & 0x200) != 0) {
          iVar1 = 2;
          if (local_21 == 1) {
            iVar1 = 1;
          }
          local_48 = (sqlite3 *)((long)&local_38->pVfs + (long)iVar1);
        }
        in_stack_ffffffffffffffa0 = local_48;
        if ((long)local_48 < 0x21) {
          in_stack_ffffffffffffffa0 = (sqlite3 *)0x20;
        }
        iVar1 = sqlite3VdbeMemClearAndResize((Mem *)in_stack_ffffffffffffff98,0);
        if (iVar1 != 0) {
          return 7;
        }
        memcpy(*(void **)(in_RDI + 8),in_RSI,(size_t)local_48);
      }
      else {
        sqlite3VdbeMemRelease((Mem *)0x13eb81);
        *(char **)(in_RDI + 8) = in_RSI;
        if (in_R8 == sqlite3OomClear) {
          *(undefined8 *)(in_RDI + 0x28) = *(undefined8 *)(in_RDI + 8);
          iVar1 = sqlite3DbMallocSize(in_stack_ffffffffffffff98,(void *)0x13ebc6);
          *(int *)(in_RDI + 0x20) = iVar1;
        }
        else {
          *(code **)(in_RDI + 0x30) = in_R8;
          uVar2 = 0x1000;
          if (in_R8 == (code *)0x0) {
            uVar2 = 0x2000;
          }
          local_3e = local_3e | uVar2;
        }
      }
      *(uint *)(in_RDI + 0x10) = (uint)local_38 & 0x7fffffff;
      *(ushort *)(in_RDI + 0x14) = local_3e;
      *(byte *)(in_RDI + 0x16) = local_21;
      if ((local_21 < 2) ||
         (iVar1 = sqlite3VdbeMemHandleBom((Mem *)in_stack_ffffffffffffffa0), iVar1 == 0)) {
        local_4 = 0;
      }
      else {
        local_4 = 7;
      }
    }
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemSetStr(
  Mem *pMem,          /* Memory cell to set to string value */
  const char *z,      /* String pointer */
  i64 n,              /* Bytes in string, or negative */
  u8 enc,             /* Encoding of z.  0 for BLOBs */
  void (*xDel)(void*) /* Destructor function */
){
  i64 nByte = n;      /* New value for pMem->n */
  int iLimit;         /* Maximum allowed string or blob size */
  u16 flags;          /* New value for pMem->flags */

  assert( pMem!=0 );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  assert( enc!=0 || n>=0 );

  /* If z is a NULL pointer, set pMem to contain an SQL NULL. */
  if( !z ){
    sqlite3VdbeMemSetNull(pMem);
    return SQLITE_OK;
  }

  if( pMem->db ){
    iLimit = pMem->db->aLimit[SQLITE_LIMIT_LENGTH];
  }else{
    iLimit = SQLITE_MAX_LENGTH;
  }
  if( nByte<0 ){
    assert( enc!=0 );
    if( enc==SQLITE_UTF8 ){
      nByte = strlen(z);
    }else{
      for(nByte=0; nByte<=iLimit && (z[nByte] | z[nByte+1]); nByte+=2){}
    }
    flags= MEM_Str|MEM_Term;
  }else if( enc==0 ){
    flags = MEM_Blob;
    enc = SQLITE_UTF8;
  }else{
    flags = MEM_Str;
  }
  if( nByte>iLimit ){
    if( xDel && xDel!=SQLITE_TRANSIENT ){
      if( xDel==SQLITE_DYNAMIC ){
        sqlite3DbFree(pMem->db, (void*)z);
      }else{
        xDel((void*)z);
      }
    }
    sqlite3VdbeMemSetNull(pMem);
    return sqlite3ErrorToParser(pMem->db, SQLITE_TOOBIG);
  }

  /* The following block sets the new values of Mem.z and Mem.xDel. It
  ** also sets a flag in local variable "flags" to indicate the memory
  ** management (one of MEM_Dyn or MEM_Static).
  */
  if( xDel==SQLITE_TRANSIENT ){
    i64 nAlloc = nByte;
    if( flags&MEM_Term ){
      nAlloc += (enc==SQLITE_UTF8?1:2);
    }
    testcase( nAlloc==0 );
    testcase( nAlloc==31 );
    testcase( nAlloc==32 );
    if( sqlite3VdbeMemClearAndResize(pMem, (int)MAX(nAlloc,32)) ){
      return SQLITE_NOMEM_BKPT;
    }
    memcpy(pMem->z, z, nAlloc);
  }else{
    sqlite3VdbeMemRelease(pMem);
    pMem->z = (char *)z;
    if( xDel==SQLITE_DYNAMIC ){
      pMem->zMalloc = pMem->z;
      pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->zMalloc);
    }else{
      pMem->xDel = xDel;
      flags |= ((xDel==SQLITE_STATIC)?MEM_Static:MEM_Dyn);
    }
  }

  pMem->n = (int)(nByte & 0x7fffffff);
  pMem->flags = flags;
  pMem->enc = enc;

#ifndef SQLITE_OMIT_UTF16
  if( enc>SQLITE_UTF8 && sqlite3VdbeMemHandleBom(pMem) ){
    return SQLITE_NOMEM_BKPT;
  }
#endif


  return SQLITE_OK;
}